

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.c
# Opt level: O0

void load_area(FILE *fp)

{
  int iVar1;
  AREA_DATA_conflict *flag_table;
  char *pcVar2;
  FILE *in_RDI;
  __type_conflict2 _Var3;
  long *unaff_retaddr;
  AREA_DATA_conflict *pArea;
  FILE *in_stack_00002410;
  FILE *in_stack_00004008;
  
  flag_table = (AREA_DATA_conflict *)operator_new(0x170);
  pcVar2 = fread_string(in_stack_00004008);
  flag_table->file_name = pcVar2;
  flag_table->prev = (AREA_DATA_conflict *)0x0;
  zero_vector(flag_table->area_flags);
  _Var3 = std::pow<int,int>(0,0x5bacd8);
  flag_table->area_flags[0] = (long)_Var3 | flag_table->area_flags[0];
  flag_table->vnum = top_area;
  flag_table->affected = (AREA_AFFECT_DATA *)0x0;
  pcVar2 = fread_string(in_stack_00004008);
  flag_table->name = pcVar2;
  pcVar2 = fread_string(in_stack_00004008);
  flag_table->credits = pcVar2;
  iVar1 = fread_number(in_stack_00002410);
  flag_table->low_range = (short)iVar1;
  iVar1 = fread_number(in_stack_00002410);
  flag_table->high_range = (short)iVar1;
  iVar1 = fread_number(in_stack_00002410);
  flag_table->min_vnum = (short)iVar1;
  iVar1 = fread_number(in_stack_00002410);
  flag_table->max_vnum = (short)iVar1;
  fread_word(fp);
  iVar1 = flag_lookup((char *)in_RDI,(flag_type *)flag_table);
  flag_table->area_type = (short)iVar1;
  fread_word(fp);
  iVar1 = climate_lookup((char *)in_RDI);
  flag_table->climate = (short)iVar1;
  fread_flag_new(unaff_retaddr,in_RDI);
  iVar1 = fread_number(in_stack_00002410);
  flag_table->security = iVar1;
  pcVar2 = fread_string(in_stack_00004008);
  flag_table->builders = pcVar2;
  flag_table->age = 0xf;
  flag_table->nplayer = 0;
  flag_table->empty = false;
  flag_table->nplayer = 0;
  zero_vector(flag_table->affected_by);
  zero_vector(flag_table->progtypes);
  flag_table->aprogs = (APROG_DATA *)0x0;
  flag_table->temp = 0;
  flag_table->sky = 0;
  if (area_first == (AREA_DATA_conflict *)0x0) {
    area_first = flag_table;
  }
  if (area_last != (AREA_DATA_conflict *)0x0) {
    area_last->next = flag_table;
    flag_table->prev = area_last;
    _Var3 = std::pow<int,int>(0,0x5baee7);
    area_last->area_flags[0] = ((long)_Var3 ^ 0xffffffffffffffffU) & area_last->area_flags[0];
  }
  area_last = flag_table;
  area_last->next = (AREA_DATA_conflict *)0x0;
  top_area = top_area + 1;
  return;
}

Assistant:

void load_area(FILE *fp)
{
	AREA_DATA *pArea;

	pArea = new AREA_DATA;
	/*
	pArea->reset_first	= nullptr;
	pArea->reset_last	= nullptr;
	*/
	pArea->file_name = fread_string(fp);

	pArea->prev = nullptr;

	zero_vector(pArea->area_flags);
	SET_BIT(pArea->area_flags, AREA_LOADING); /* OLC */
	pArea->vnum = top_area;					  /* OLC */
	pArea->affected = nullptr;
	pArea->name = fread_string(fp);
	pArea->credits = fread_string(fp);
	pArea->low_range = fread_number(fp);
	pArea->high_range = fread_number(fp);
	pArea->min_vnum = fread_number(fp);
	pArea->max_vnum = fread_number(fp);
	pArea->area_type = flag_lookup(fread_word(fp), area_type_table);
	pArea->climate = climate_lookup(fread_word(fp));
	fread_flag_new(pArea->area_flags, fp);

	pArea->security = fread_number(fp);
	pArea->builders = fread_string(fp);
	pArea->age = 15;
	pArea->nplayer = 0;
	pArea->empty= false;
	pArea->nplayer = 0;
	zero_vector(pArea->affected_by);

	/* Morg - Valgrind fix. */
	zero_vector(pArea->progtypes);
	pArea->aprogs = nullptr;
	pArea->temp = 0;
	pArea->sky = 0;

	if (!area_first)
		area_first = pArea;

	if (area_last)
	{
		area_last->next = pArea;
		pArea->prev = area_last;

		REMOVE_BIT(area_last->area_flags, AREA_LOADING); /* OLC */
	}

	area_last = pArea;
	pArea->next = nullptr;

	top_area++;
}